

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damageind.cpp
# Opt level: O0

void __thiscall CDamageInd::Create(CDamageInd *this,vec2 Pos,vec2 Dir)

{
  long lVar1;
  CItem *pCVar2;
  CDamageInd *in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  vec2 in_XMM0_Qa;
  vector2_base<float> vVar4;
  CItem *pItem;
  vector2_base<float> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = CreateItem(in_RDI);
  if (pCVar2 != (CItem *)0x0) {
    pCVar2->m_Pos = in_XMM0_Qa;
    pCVar2->m_LifeTime = 0.75;
    vVar4 = vector2_base<float>::operator*(in_stack_ffffffffffffffe0,(float)((ulong)in_RDI >> 0x20))
    ;
    (pCVar2->m_Dir).field_0 = vVar4.field_0;
    (pCVar2->m_Dir).field_1 = vVar4.field_1;
    fVar3 = random_float();
    pCVar2->m_StartAngle = (fVar3 - 1.0) * 2.0 * 3.1415927;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDamageInd::Create(vec2 Pos, vec2 Dir)
{
	CItem *pItem = CreateItem();
	if(pItem)
	{
		pItem->m_Pos = Pos;
		pItem->m_LifeTime = 0.75f;
		pItem->m_Dir = Dir*-1;
		pItem->m_StartAngle = (random_float() - 1.0f) * 2.0f * pi;
	}
}